

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_CCtx_params ret;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [24];
  undefined1 in_stack_fffffffffffffed4 [108];
  undefined1 auVar15 [24];
  undefined1 local_b0 [12];
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint uStack_98;
  ZSTD_strategy ZStack_94;
  ZSTD_frameParameters local_90;
  undefined4 local_84;
  
  bVar5 = 0;
  uVar10 = params.cParams.minMatch;
  uVar6 = params.cParams.hashLog;
  uVar8 = params.cParams.searchLog;
  uVar7 = uVar6;
  uVar9 = uVar8;
  uVar11 = uVar10;
  uVar12 = params.cParams._20_8_;
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 < 0xffffffffffffff89) {
    memcpy(local_b0,&cctx->requestedParams,0x80);
    local_b0._4_4_ = params.cParams.windowLog;
    local_b0._8_4_ = params.cParams.chainLog;
    uStack_98 = params.cParams.targetLength;
    ZStack_94 = params.cParams.strategy;
    local_90.contentSizeFlag = params.fParams.contentSizeFlag;
    local_90.checksumFlag = params.fParams.checksumFlag;
    local_90.noDictIDFlag = params.fParams.noDictIDFlag;
    local_84 = 3;
    puVar3 = (undefined8 *)local_b0;
    puVar4 = (undefined8 *)&stack0xfffffffffffffec0;
    uStack_a4 = uVar6;
    uStack_a0 = uVar8;
    uStack_9c = uVar10;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    params_00.cParams.windowLog = uVar9;
    params_00.format = uVar7;
    params_00.cParams.chainLog = uVar11;
    params_00.cParams.hashLog = (uint)uVar12;
    params_00.cParams.searchLog = SUB84(uVar12,4);
    auVar13 = in_stack_fffffffffffffed4._12_12_;
    auVar14 = in_stack_fffffffffffffed4._60_24_;
    auVar15 = in_stack_fffffffffffffed4._84_24_;
    params_00.cParams.minMatch = in_stack_fffffffffffffed4._0_4_;
    params_00.cParams.targetLength = in_stack_fffffffffffffed4._4_4_;
    params_00.cParams.strategy = in_stack_fffffffffffffed4._8_4_;
    params_00.fParams.contentSizeFlag = auVar13._0_4_;
    params_00.fParams.checksumFlag = auVar13._4_4_;
    params_00.fParams.noDictIDFlag = auVar13._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffed4._24_4_;
    params_00.forceWindow = in_stack_fffffffffffffed4._28_4_;
    params_00.attachDictPref = in_stack_fffffffffffffed4._32_4_;
    params_00.nbWorkers = in_stack_fffffffffffffed4._36_4_;
    params_00._60_4_ = in_stack_fffffffffffffed4._40_4_;
    params_00.jobSize = in_stack_fffffffffffffed4._44_8_;
    params_00.overlapLog = in_stack_fffffffffffffed4._52_4_;
    params_00.rsyncable = in_stack_fffffffffffffed4._56_4_;
    params_00.ldmParams.enableLdm = auVar14._0_4_;
    params_00.ldmParams.hashLog = auVar14._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar14._8_4_;
    params_00.ldmParams.minMatchLength = auVar14._12_4_;
    params_00.ldmParams.hashRateLog = auVar14._16_4_;
    params_00.ldmParams.windowLog = auVar14._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar15._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar15._8_8_;
    params_00.customMem.opaque = (void *)auVar15._16_8_;
    sVar1 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,params_00);
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    CHECK_F(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  params);
}